

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::PopulateTcParseFastEntries
          (Reflection *this,TailCallTableInfo *table_info,FastFieldEntry *fast_entries)

{
  uint8_t hasbit_idx;
  uint8_t aux_idx;
  uint16_t coded_tag;
  bool bVar1;
  uint32_t uVar2;
  TailCallParseFunc p_Var3;
  LogMessage *pLVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_c8;
  FastFieldEntry local_c0 [2];
  byte local_99;
  LogMessage local_98;
  Voidify local_81;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_80;
  FastFieldEntry local_78;
  Field *local_68;
  Field *as_field;
  FastFieldEntry local_58;
  NonField *local_48;
  NonField *nonfield;
  FastFieldInfo *fast_field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  *__range2;
  FastFieldEntry *fast_entries_local;
  TailCallTableInfo *table_info_local;
  Reflection *this_local;
  
  __end2 = std::
           vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
           ::begin(&table_info->fast_path_fields);
  fast_field = (FastFieldInfo *)
               std::
               vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
               ::end(&table_info->fast_path_fields);
  __range2 = (vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
              *)fast_entries;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::internal::TailCallTableInfo::FastFieldInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>_>
                                *)&fast_field);
    if (!bVar1) {
      return;
    }
    nonfield = (NonField *)
               __gnu_cxx::
               __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::FastFieldInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>_>
               ::operator*(&__end2);
    local_48 = internal::TailCallTableInfo::FastFieldInfo::AsNonField((FastFieldInfo *)nonfield);
    if (local_48 == (NonField *)0x0) {
      local_68 = internal::TailCallTableInfo::FastFieldInfo::AsField((FastFieldInfo *)nonfield);
      if (local_68 == (Field *)0x0) {
        bVar1 = internal::TailCallTableInfo::FastFieldInfo::is_empty((FastFieldInfo *)nonfield);
        local_99 = 0;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_98,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0xdad,"fast_field.is_empty()");
          local_99 = 1;
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar4);
        }
        if ((local_99 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_98);
        }
        internal::TcFieldData::TcFieldData((TcFieldData *)&local_c8);
        internal::TcParseTableBase::FastFieldEntry::FastFieldEntry
                  (local_c0,internal::TcParser::MiniParse,(TcFieldData)local_c8);
        internal::TcParseTableBase::FastFieldEntry::operator=((FastFieldEntry *)__range2,local_c0);
      }
      else {
        p_Var3 = GetFastParseFunction(local_68->func);
        coded_tag = local_68->coded_tag;
        hasbit_idx = local_68->hasbit_idx;
        aux_idx = local_68->aux_idx;
        uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,local_68->field);
        internal::TcFieldData::TcFieldData
                  ((TcFieldData *)&local_80,coded_tag,hasbit_idx,aux_idx,(uint16_t)uVar2);
        internal::TcParseTableBase::FastFieldEntry::FastFieldEntry
                  (&local_78,p_Var3,(TcFieldData)local_80);
        internal::TcParseTableBase::FastFieldEntry::operator=((FastFieldEntry *)__range2,&local_78);
      }
    }
    else {
      p_Var3 = GetFastParseFunction(local_48->func);
      internal::TcFieldData::TcFieldData
                ((TcFieldData *)&as_field,local_48->coded_tag,local_48->nonfield_info);
      internal::TcParseTableBase::FastFieldEntry::FastFieldEntry
                (&local_58,p_Var3,(TcFieldData)as_field);
      internal::TcParseTableBase::FastFieldEntry::operator=((FastFieldEntry *)__range2,&local_58);
    }
    __range2 = (vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                *)&(__range2->
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::internal::TailCallTableInfo::FastFieldInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void Reflection::PopulateTcParseFastEntries(
    const internal::TailCallTableInfo& table_info,
    TcParseTableBase::FastFieldEntry* fast_entries) const {
  for (const auto& fast_field : table_info.fast_path_fields) {
    if (auto* nonfield = fast_field.AsNonField()) {
      // No field, but still a special entry.
      *fast_entries++ = {GetFastParseFunction(nonfield->func),
                         {nonfield->coded_tag, nonfield->nonfield_info}};
    } else if (auto* as_field = fast_field.AsField()) {
      *fast_entries++ = {
          GetFastParseFunction(as_field->func),
          {as_field->coded_tag, as_field->hasbit_idx, as_field->aux_idx,
           static_cast<uint16_t>(schema_.GetFieldOffset(as_field->field))}};
    } else {
      ABSL_DCHECK(fast_field.is_empty());
      // No fast entry here. Use mini parser.
      *fast_entries++ = {internal::TcParser::MiniParse, {}};
    }
  }
}